

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseReservedNumbers
          (Parser *this,EnumDescriptorProto *message,LocationRecorder *parent_location)

{
  bool bVar1;
  int path1;
  Token *pTVar2;
  char *error;
  undefined1 local_f0 [8];
  LocationRecorder end_location_1;
  LocationRecorder end_location;
  undefined1 local_b8 [8];
  LocationRecorder start_location;
  Token start_token;
  int32_t local_60;
  int end;
  int start;
  EnumDescriptorProto_EnumReservedRange *local_50;
  EnumReservedRange *range;
  LocationRecorder location;
  bool first;
  LocationRecorder *parent_location_local;
  EnumDescriptorProto *message_local;
  Parser *this_local;
  
  location.location_._7_1_ = 1;
  do {
    path1 = EnumDescriptorProto::reserved_range_size(message);
    LocationRecorder::LocationRecorder((LocationRecorder *)&range,parent_location,path1);
    local_50 = EnumDescriptorProto::add_reserved_range(message);
    io::Tokenizer::Token::Token((Token *)&start_location.location_);
    LocationRecorder::LocationRecorder((LocationRecorder *)local_b8,(LocationRecorder *)&range,1);
    pTVar2 = io::Tokenizer::current(this->input_);
    io::Tokenizer::Token::operator=((Token *)&start_location.location_,pTVar2);
    error = "Expected enum number range.";
    if ((location.location_._7_1_ & 1) != 0) {
      error = "Expected enum value or number range.";
    }
    bVar1 = ConsumeSignedInteger(this,&local_60,error);
    if (!bVar1) {
      this_local._7_1_ = 0;
    }
    bVar1 = !bVar1;
    LocationRecorder::~LocationRecorder((LocationRecorder *)local_b8);
    if (!bVar1) {
      bVar1 = TryConsume(this,"to");
      if (bVar1) {
        LocationRecorder::LocationRecorder
                  ((LocationRecorder *)&end_location_1.location_,(LocationRecorder *)&range,2);
        bVar1 = TryConsume(this,"max");
        if (bVar1) {
          start_token._52_4_ = 0x7fffffff;
LAB_00639339:
          bVar1 = false;
        }
        else {
          bVar1 = ConsumeSignedInteger(this,(int *)&start_token.field_0x34,"Expected integer.");
          if (bVar1) goto LAB_00639339;
          this_local._7_1_ = 0;
          bVar1 = true;
        }
        LocationRecorder::~LocationRecorder((LocationRecorder *)&end_location_1.location_);
        if (bVar1) goto LAB_006393fd;
      }
      else {
        LocationRecorder::LocationRecorder
                  ((LocationRecorder *)local_f0,(LocationRecorder *)&range,2);
        LocationRecorder::StartAt((LocationRecorder *)local_f0,(Token *)&start_location.location_);
        LocationRecorder::EndAt((LocationRecorder *)local_f0,(Token *)&start_location.location_);
        start_token._52_4_ = local_60;
        LocationRecorder::~LocationRecorder((LocationRecorder *)local_f0);
      }
      EnumDescriptorProto_EnumReservedRange::set_start(local_50,local_60);
      EnumDescriptorProto_EnumReservedRange::set_end(local_50,start_token._52_4_);
      location.location_._7_1_ = 0;
      bVar1 = false;
    }
LAB_006393fd:
    io::Tokenizer::Token::~Token((Token *)&start_location.location_);
    LocationRecorder::~LocationRecorder((LocationRecorder *)&range);
    if (bVar1) goto LAB_0063947d;
    bVar1 = TryConsume(this,",");
  } while (bVar1);
  bVar1 = ConsumeEndOfDeclaration(this,";",parent_location);
  if (bVar1) {
    this_local._7_1_ = 1;
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_0063947d:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::ParseReservedNumbers(EnumDescriptorProto* message,
                                  const LocationRecorder& parent_location) {
  bool first = true;
  do {
    LocationRecorder location(parent_location, message->reserved_range_size());

    EnumDescriptorProto::EnumReservedRange* range =
        message->add_reserved_range();
    int start, end;
    io::Tokenizer::Token start_token;
    {
      LocationRecorder start_location(
          location, EnumDescriptorProto::EnumReservedRange::kStartFieldNumber);
      start_token = input_->current();
      DO(ConsumeSignedInteger(&start,
                              (first ? "Expected enum value or number range."
                                     : "Expected enum number range.")));
    }

    if (TryConsume("to")) {
      LocationRecorder end_location(
          location, EnumDescriptorProto::EnumReservedRange::kEndFieldNumber);
      if (TryConsume("max")) {
        // This is in the enum descriptor path, which doesn't have the message
        // set duality to fix up, so it doesn't integrate with the sentinel.
        end = INT_MAX;
      } else {
        DO(ConsumeSignedInteger(&end, "Expected integer."));
      }
    } else {
      LocationRecorder end_location(
          location, EnumDescriptorProto::EnumReservedRange::kEndFieldNumber);
      end_location.StartAt(start_token);
      end_location.EndAt(start_token);
      end = start;
    }

    range->set_start(start);
    range->set_end(end);
    first = false;
  } while (TryConsume(","));

  DO(ConsumeEndOfDeclaration(";", &parent_location));
  return true;
}